

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall slang::syntax::Delay3Syntax::getChild(Delay3Syntax *this,size_t index)

{
  Token token;
  Token token_00;
  Token token_01;
  Token token_02;
  Token token_03;
  undefined8 in_RDX;
  Info *in_RSI;
  TokenOrSyntax *in_RDI;
  SyntaxNode *in_stack_ffffffffffffff78;
  TokenOrSyntax *pTVar1;
  
  switch(in_RDX) {
  case 0:
    token.info = in_RSI;
    token._0_8_ = in_RDI;
    TokenOrSyntax::TokenOrSyntax(in_RDI,token);
    break;
  case 1:
    token_00.info = in_RSI;
    token_00._0_8_ = in_RDI;
    TokenOrSyntax::TokenOrSyntax(in_RDI,token_00);
    break;
  case 2:
    pTVar1 = in_RDI;
    not_null<slang::syntax::ExpressionSyntax_*>::get
              ((not_null<slang::syntax::ExpressionSyntax_*> *)&in_RSI[3].location);
    TokenOrSyntax::TokenOrSyntax(in_RDI,in_stack_ffffffffffffff78);
    in_RDI = pTVar1;
    break;
  case 3:
    token_01.info = in_RSI;
    token_01._0_8_ = in_RDI;
    TokenOrSyntax::TokenOrSyntax(in_RDI,token_01);
    break;
  case 4:
    TokenOrSyntax::TokenOrSyntax(in_RDI,in_stack_ffffffffffffff78);
    break;
  case 5:
    token_02.info = in_RSI;
    token_02._0_8_ = in_RDI;
    TokenOrSyntax::TokenOrSyntax(in_RDI,token_02);
    break;
  case 6:
    TokenOrSyntax::TokenOrSyntax(in_RDI,in_stack_ffffffffffffff78);
    break;
  case 7:
    token_03.info = in_RSI;
    token_03._0_8_ = in_RDI;
    TokenOrSyntax::TokenOrSyntax(in_RDI,token_03);
    break;
  default:
    TokenOrSyntax::TokenOrSyntax((TokenOrSyntax *)in_RSI,in_RDI);
  }
  return in_RDI;
}

Assistant:

TokenOrSyntax Delay3Syntax::getChild(size_t index) {
    switch (index) {
        case 0: return hash;
        case 1: return openParen;
        case 2: return delay1.get();
        case 3: return comma1;
        case 4: return delay2;
        case 5: return comma2;
        case 6: return delay3;
        case 7: return closeParen;
        default: return nullptr;
    }
}